

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsUtil.h
# Opt level: O2

void __thiscall FileTree::insertNode(FileTree *this,string *value,bool isFile)

{
  TreeNode *pTVar1;
  bool bVar2;
  TreeNode *this_00;
  TreeNode **ppTVar3;
  TreeNode *pTVar4;
  TreeNode *nodeParent;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_68;
  string local_48;
  
  nodeParent = this->root;
  std::__cxx11::string::string((string *)&local_48,(string *)value);
  bVar2 = findNode(this,&local_48,isFile,&nodeParent);
  std::__cxx11::string::~string((string *)&local_48);
  if (!bVar2) {
    split(&files,value,'/');
    this_00 = (TreeNode *)operator_new(0x40);
    std::__cxx11::string::string
              ((string *)&local_68,
               (string *)
               (files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    TreeNode::TreeNode(this_00,&local_68,isFile);
    std::__cxx11::string::~string((string *)&local_68);
    this_00->parent = nodeParent;
    pTVar1 = nodeParent->firstChild;
    if (nodeParent->firstChild == (TreeNode *)0x0) {
      ppTVar3 = &nodeParent->firstChild;
    }
    else {
      do {
        pTVar4 = pTVar1;
        pTVar1 = pTVar4->nextSibling;
      } while (pTVar1 != (TreeNode *)0x0);
      ppTVar3 = &pTVar4->nextSibling;
    }
    *ppTVar3 = this_00;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files);
  }
  return;
}

Assistant:

void insertNode(const std::string value, bool isFile)
    {
        TreeNode *nodeParent = root;

        //bool isFound = findNode(value, isFile, nodeParent);
        bool isFound = findNode(value, isFile, nodeParent);


        if (!isFound)
        {
            std::vector<std::string> files = split(value, '/');
            TreeNode* newNode = new TreeNode(files.back(), isFile);

            newNode->parent = nodeParent;

            TreeNode *temp = nodeParent->firstChild;

            if (temp == nullptr)
            {
                nodeParent->firstChild = newNode;
            }

            else
            {
                while (temp->nextSibling != nullptr)
                {
                    temp = temp->nextSibling;
                }

                temp->nextSibling = newNode;


            }
        }
    }